

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplaceRealloc<slang::SourceLocation>
          (SmallVectorBase<slang::SourceLocation> *this,pointer pos,SourceLocation *args)

{
  ulong uVar1;
  size_type sVar2;
  SourceLocation *pSVar3;
  pointer pSVar4;
  SourceLocation *pSVar5;
  long lVar6;
  long lVar7;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pSVar3 = (SourceLocation *)detail::allocArray(capacity,8);
  *(SourceLocation *)((long)pSVar3 + lVar7) = *args;
  pSVar4 = this->data_;
  sVar2 = this->len;
  pSVar5 = pSVar3;
  if (pSVar4 + sVar2 == pos) {
    if (sVar2 != 0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)&pSVar3->field_0x0 + lVar6) =
             *(undefined8 *)((long)&pSVar4->field_0x0 + lVar6);
        lVar6 = lVar6 + 8;
      } while (sVar2 << 3 != lVar6);
    }
  }
  else {
    for (; pSVar4 != pos; pSVar4 = pSVar4 + 1) {
      *pSVar5 = *pSVar4;
      pSVar5 = pSVar5 + 1;
    }
    sVar2 = this->len;
    pSVar4 = this->data_;
    if (pSVar4 + sVar2 != pos) {
      pSVar5 = (SourceLocation *)((long)pSVar3 + lVar7);
      do {
        pSVar5 = pSVar5 + 1;
        *pSVar5 = *pos;
        pos = pos + 1;
      } while (pos != pSVar4 + sVar2);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar3;
  return (pointer)((long)pSVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}